

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_> *
__thiscall
Catch::Generators::
makeGenerators<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>
          (Generators<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>
           *__return_storage_ptr__,Generators *this,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *val,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_1,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_2,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_3,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_4,
          unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>
          *moreGenerators_5)

{
  long *local_38;
  
  value<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>
            ((Generators *)&local_38,
             (unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128> *)this);
  Generators<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>::
  Generators<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>,unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>
            ((Generators<unary_op_tuple<trng::optimized_impl::uint128,trng::optimized_impl::uint128>>
              *)__return_storage_ptr__,
             (GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>
              *)&local_38,val,moreGenerators,moreGenerators_1,moreGenerators_2,moreGenerators_3,
             moreGenerators_4);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }